

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O0

bool bssl::anon_unknown_18::VerifyAuthorizedResponderCert
               (ParsedCertificate *responder_certificate,ParsedCertificate *issuer_certificate)

{
  SignatureAlgorithm algorithm;
  bool bVar1;
  SignatureAlgorithm *pSVar2;
  BitString *signature_value;
  ParsedTbsCertificate *pPVar3;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *this;
  Input IVar4;
  byte local_a1;
  Span<const_unsigned_char> local_a0;
  Span<const_unsigned_char> local_90;
  uchar *local_80;
  size_t local_78;
  reference local_70;
  Input *key_purpose_oid;
  const_iterator __end2;
  const_iterator __begin2;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *__range2;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_30;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_28;
  ParsedCertificate *local_20;
  ParsedCertificate *issuer_certificate_local;
  ParsedCertificate *responder_certificate_local;
  
  local_20 = issuer_certificate;
  issuer_certificate_local = responder_certificate;
  local_28 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
             ParsedCertificate::signature_algorithm(responder_certificate);
  bVar1 = ::std::optional<bssl::SignatureAlgorithm>::has_value
                    ((optional<bssl::SignatureAlgorithm> *)&local_28);
  local_a1 = 1;
  if (bVar1) {
    local_30 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
               ParsedCertificate::signature_algorithm(issuer_certificate_local);
    pSVar2 = ::std::optional<bssl::SignatureAlgorithm>::operator*
                       ((optional<bssl::SignatureAlgorithm> *)&local_30);
    algorithm = *pSVar2;
    IVar4 = ParsedCertificate::tbs_certificate_tlv(issuer_certificate_local);
    signature_value = ParsedCertificate::signature_value(issuer_certificate_local);
    pPVar3 = ParsedCertificate::tbs(local_20);
    bVar1 = VerifySignedData(algorithm,IVar4,signature_value,(Input)(pPVar3->spki_tlv).data_,
                             (SignatureVerifyCache *)0x0);
    local_a1 = bVar1 ^ 0xff;
  }
  if (((local_a1 & 1) == 0) &&
     (bVar1 = ParsedCertificate::has_extended_key_usage(issuer_certificate_local), bVar1)) {
    this = ParsedCertificate::extended_key_usage(issuer_certificate_local);
    __end2 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::begin(this);
    key_purpose_oid =
         (Input *)::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                                       *)&key_purpose_oid), bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                 ::operator*(&__end2);
      local_80 = (local_70->data_).data_;
      local_78 = (local_70->data_).size_;
      Span<unsigned_char_const>::Span<8ul>
                ((Span<unsigned_char_const> *)&local_a0,(uchar (*) [8])&kOCSPSigning);
      bssl::der::Input::Input((Input *)&local_90,local_a0);
      IVar4.data_.size_ = local_78;
      IVar4.data_.data_ = local_80;
      bVar1 = bssl::der::operator==(IVar4,(Input)local_90);
      if (bVar1) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
      ::operator++(&__end2);
    }
  }
  return false;
}

Assistant:

[[nodiscard]] bool VerifyAuthorizedResponderCert(
    const ParsedCertificate *responder_certificate,
    const ParsedCertificate *issuer_certificate) {
  // The Authorized Responder must be directly signed by the issuer of the
  // certificate being checked.
  // TODO(eroman): Must check the signature algorithm against policy.
  if (!responder_certificate->signature_algorithm().has_value() ||
      !VerifySignedData(*responder_certificate->signature_algorithm(),
                        responder_certificate->tbs_certificate_tlv(),
                        responder_certificate->signature_value(),
                        issuer_certificate->tbs().spki_tlv,
                        /*cache=*/nullptr)) {
    return false;
  }

  // The Authorized Responder must include the value id-kp-OCSPSigning as
  // part of the extended key usage extension.
  if (!responder_certificate->has_extended_key_usage()) {
    return false;
  }

  for (const auto &key_purpose_oid :
       responder_certificate->extended_key_usage()) {
    if (key_purpose_oid == der::Input(kOCSPSigning)) {
      return true;
    }
  }
  return false;
}